

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature.cpp
# Opt level: O1

void __thiscall Polymerase::MoveBack(Polymerase *this)

{
  int *piVar1;
  int iVar2;
  SpeciesTracker *pSVar3;
  runtime_error *this_00;
  long *plVar4;
  long *plVar5;
  long *local_60;
  long local_58;
  long local_50;
  long lStack_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if ((this->super_MobileElement).start_ < 1) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_40,"Attempting to assign negative start position to Polymerase object \'",
                   &(this->super_MobileElement).name_);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_40);
    local_60 = (long *)*plVar4;
    plVar5 = plVar4 + 2;
    if (local_60 == plVar5) {
      local_50 = *plVar5;
      lStack_48 = plVar4[3];
      local_60 = &local_50;
    }
    else {
      local_50 = *plVar5;
    }
    local_58 = plVar4[1];
    *plVar4 = (long)plVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::runtime_error::runtime_error(this_00,(string *)&local_60);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar2 = std::__cxx11::string::compare((char *)&(this->super_MobileElement).name_);
  if (iVar2 == 0) {
    pSVar3 = SpeciesTracker::Instance();
    iVar2 = -3;
    if ((pSVar3->codon_map_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)
    goto LAB_00115850;
  }
  iVar2 = -1;
LAB_00115850:
  piVar1 = &(this->super_MobileElement).start_;
  *piVar1 = *piVar1 + iVar2;
  piVar1 = &(this->super_MobileElement).stop_;
  *piVar1 = *piVar1 + iVar2;
  return;
}

Assistant:

void Polymerase::MoveBack() {
  if (start_ > 0) {
    if (name_ == "__ribosome" && !SpeciesTracker::Instance().codon_map().empty()) {
    start_ -= 3;
    stop_ -= 3;
    } else {
      start_--;
      stop_--;
    }
  } else {
    throw std::runtime_error(
        "Attempting to assign negative start position to Polymerase object '" +
        name_ + "'.");
  }
}